

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void __thiscall
duckdb::HistogramBinFinalizeFunction<duckdb::HistogramGenericFunctor,duckdb::string_t>
          (duckdb *this,Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
          idx_t offset)

{
  ulong *puVar1;
  long *plVar2;
  ArenaAllocator *pAVar3;
  data_ptr_t pdVar4;
  ArenaAllocator *this_00;
  byte bVar5;
  undefined8 uVar6;
  element_type *peVar7;
  bool bVar8;
  Allocator *index;
  LogicalType *type;
  Vector *this_01;
  Vector *pVVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  ulong uVar11;
  Allocator **ppAVar12;
  ulong uVar13;
  long lVar14;
  OrderModifiers modifiers;
  ulong uVar15;
  long lVar16;
  string_t sort_key;
  UnifiedVectorFormat sdata;
  unsigned_long local_c0;
  Value local_b8;
  UnifiedVectorFormat local_78;
  
  modifiers = SUB82(offset,0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat((Vector *)this,(idx_t)result,&local_78);
  FlatVector::VerifyFlatVector((Vector *)param_2);
  index = (Allocator *)ListVector::GetListSize((Vector *)param_2);
  type = MapType::KeyType((LogicalType *)&param_2->allocator);
  bVar8 = SupportsOtherBucket(type);
  if (result == (Vector *)0x0) {
    lVar14 = 0;
  }
  else {
    lVar14 = 0;
    uVar11 = 0;
    do {
      uVar15 = uVar11;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)(local_78.sel)->sel_vector[uVar11];
      }
      plVar2 = (long *)**(long **)(local_78.data + uVar15 * 8);
      if (plVar2 != (long *)0x0) {
        lVar14 = (ulong)(*(long *)(*(long *)((*(long **)(local_78.data + uVar15 * 8))[1] + 8) + -8)
                         != 0 && bVar8) + (plVar2[1] - *plVar2 >> 4) + lVar14;
      }
      uVar11 = uVar11 + 1;
    } while (result != (Vector *)uVar11);
  }
  ListVector::Reserve((Vector *)param_2,(long)&index->allocate_function + lVar14);
  this_01 = MapVector::GetKeys((Vector *)param_2);
  pVVar9 = MapVector::GetValues((Vector *)param_2);
  if (result != (Vector *)0x0) {
    pAVar3 = param_2[1].allocator;
    pdVar4 = pVVar9->data;
    uVar11 = 0;
    do {
      uVar15 = uVar11;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)(local_78.sel)->sel_vector[uVar11];
      }
      uVar13 = uVar11 + count;
      plVar2 = *(long **)(local_78.data + uVar15 * 8);
      if (*plVar2 == 0) {
        if (*(long *)&param_2[1].combine_type == 0) {
          local_c0 = *(unsigned_long *)&param_2[2].combine_type;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_c0);
          peVar7 = local_b8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar6 = local_b8.type_._0_8_;
          local_b8.type_._0_8_ = (FunctionData *)0x0;
          local_b8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          this_00 = param_2[2].allocator;
          param_2[2].bind_data.ptr = (FunctionData *)uVar6;
          param_2[2].allocator = (ArenaAllocator *)peVar7;
          if (this_00 != (ArenaAllocator *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          if ((ArenaAllocator *)
              local_b8.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (ArenaAllocator *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_b8.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (param_2 + 2));
          *(unsigned_long **)&param_2[1].combine_type =
               (unsigned_long *)
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar13 & 0x3f;
        puVar1 = (ulong *)(*(long *)&param_2[1].combine_type + (uVar13 >> 6) * 8);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      else {
        (&pAVar3->allocator)[uVar13 * 2] = index;
        lVar14 = *(long *)*plVar2;
        if (((long *)*plVar2)[1] != lVar14) {
          lVar16 = 8;
          uVar15 = 0;
          do {
            sort_key.value.pointer.ptr = (char *)this_01;
            sort_key.value._0_8_ = *(undefined8 *)(lVar14 + lVar16);
            CreateSortKeyHelpers::DecodeSortKey
                      (*(CreateSortKeyHelpers **)(lVar14 + -8 + lVar16),sort_key,
                       (Vector *)((long)&index->allocate_function + uVar15),0x302,modifiers);
            *(undefined8 *)(pdVar4 + uVar15 * 8 + (long)index * 8) =
                 *(undefined8 *)(*(long *)plVar2[1] + uVar15 * 8);
            uVar15 = uVar15 + 1;
            lVar14 = *(long *)*plVar2;
            lVar16 = lVar16 + 0x10;
          } while (uVar15 < (ulong)(((long *)*plVar2)[1] - lVar14 >> 4));
          index = (Allocator *)((long)&index->allocate_function + uVar15);
        }
        if (bVar8 && *(long *)(*(long *)(plVar2[1] + 8) + -8) != 0) {
          OtherBucketValue(&local_b8,&this_01->type);
          Vector::SetValue(this_01,(idx_t)index,&local_b8);
          Value::~Value(&local_b8);
          *(undefined8 *)(pdVar4 + (long)index * 8) = *(undefined8 *)(*(long *)(plVar2[1] + 8) + -8)
          ;
          index = (Allocator *)((long)&index->allocate_function + 1);
        }
        ppAVar12 = &pAVar3->allocator + uVar13 * 2;
        ppAVar12[1] = (Allocator *)((long)index - (long)*ppAVar12);
      }
      uVar11 = uVar11 + 1;
    } while ((Vector *)uVar11 != result);
  }
  ListVector::SetListSize((Vector *)param_2,(idx_t)index);
  Vector::Verify((Vector *)param_2,(idx_t)result);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}